

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.h
# Opt level: O1

void __thiscall Triangle::Triangle(Triangle *this,Vector3f *a,Vector3f *b,Vector3f *c,Material *m)

{
  int iVar1;
  long lVar2;
  float fVar3;
  Vector3f local_60;
  Vector3f local_54;
  Vector3f local_48;
  Vector3f local_3c;
  
  (this->super_Object).remit = 0;
  (this->super_Object).m = m;
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_intersect_001faa60;
  this->empty = false;
  this->has_uv = false;
  lVar2 = 0x1c;
  do {
    Vector2f::Vector2f((Vector2f *)((long)(this->o).m_elements + lVar2 + -0x80),0.0);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x34);
  lVar2 = 0x38;
  do {
    Vector3f::Vector3f((Vector3f *)((long)(this->o).m_elements + lVar2 + -0x80),0.0);
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x5c);
  lVar2 = 0x5c;
  do {
    Vector3f::Vector3f((Vector3f *)((long)(this->o).m_elements + lVar2 + -0x80),0.0);
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x80);
  Vector3f::Vector3f(&this->o,0.0);
  Matrix3f::Matrix3f(&this->matrix,0.0);
  Vector3f::operator=((Vector3f *)&this->field_0x5c,a);
  Vector3f::operator=((Vector3f *)&this->field_0x68,b);
  Vector3f::operator=((Vector3f *)&this->field_0x74,c);
  operator-(a,b);
  operator-(a,c);
  Vector3f::cross(&local_54,&local_60);
  fVar3 = Vector3f::length(&local_48);
  this->area = fVar3 * 0.5;
  if (1e-05 <= fVar3 * 0.5) {
    iVar1 = (*m->_vptr_Material[4])(m);
    if (((char)iVar1 != '\0') && (*(char *)&m[0x28]._vptr_Material == '\0')) {
      (this->super_Object).remit = 1;
    }
    operator-(a,b);
    operator-(a,c);
    Vector3f::cross(&local_60,&local_3c);
    Vector3f::normalized(&local_48);
    Vector3f::operator=((Vector3f *)&this->field_0x38,&local_48);
    this->use_n = false;
    iVar1 = (*m->_vptr_Material[2])(m);
    if ((char)iVar1 != '\0') {
      prepare_coords(this);
    }
  }
  else {
    this->empty = true;
  }
  return;
}

Assistant:

Triangle(const Vector3f& a, const Vector3f& b, const Vector3f& c, Material* m):Object(m) {
		v[0] = a;
		v[1] = b;
		v[2] = c;
		area = Vector3f::cross(a - b, a - c).length() / 2;
		if (area < 1e-5)
		{
			empty = true;
			return;
		}
#ifdef TRIANGLE_REMIT
		if (m->is_brdf() && !((BRDFMaterial*)m)->emissionColor.is_empty())
			remit = 1;
#endif
		n[0] = Vector3f::cross(a - b,a - c).normalized(); use_n = false;
		if (m->need_coords()) prepare_coords();
	}